

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O2

void chaiscript::bootstrap::Bootstrap::opers_arithmetic_pod(Module *m)

{
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  allocator<char> local_611;
  _func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *local_610;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_608;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_5f8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_5e8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_5d8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_5c8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_5b8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_5a8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_598;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_588;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_578;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_568;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_558;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_548;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_538;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_528;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_518;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_508;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_4f8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_4e8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_4d8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_4c8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_4b8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_4a8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_498;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_488;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_478;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_468;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_458;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_448;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_438;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_428;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  local_610 = Boxed_Number::equals;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<bool(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&),bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>,bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_418,(_func_bool_Boxed_Number_ptr_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"==",&local_611);
  this = &m->m_funcs;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_418,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_418.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::less_than;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<bool(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&),bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>,bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_428,(_func_bool_Boxed_Number_ptr_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"<",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_428,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_428.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::greater_than;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<bool(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&),bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>,bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_438,(_func_bool_Boxed_Number_ptr_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,">",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_438,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_438.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::greater_than_equal;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<bool(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&),bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>,bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_448,(_func_bool_Boxed_Number_ptr_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,">=",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_448,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_448.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::less_than_equal;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<bool(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&),bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>,bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_458,(_func_bool_Boxed_Number_ptr_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"<=",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_458,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_458.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::not_equal;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<bool(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&),bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>,bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_468,(_func_bool_Boxed_Number_ptr_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"!=",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_468,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_468.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::pre_decrement;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number(chaiscript::Boxed_Number),chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number)>,chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number)>
            ((chaiscript *)&local_478,(_func_Boxed_Number_Boxed_Number **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"--",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_478,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_478.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::pre_increment;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number(chaiscript::Boxed_Number),chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number)>,chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number)>
            ((chaiscript *)&local_488,(_func_Boxed_Number_Boxed_Number **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"++",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_488,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_488.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::sum;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number_const(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_498,
             (_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"+",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_498,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_498.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::unary_plus;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number_const(chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_4a8,(_func_Boxed_Number_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"+",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_4a8,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4a8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::unary_minus;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number_const(chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_4b8,(_func_Boxed_Number_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"-",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_4b8,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4b8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::difference;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number_const(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_4c8,
             (_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"-",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_4c8,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4c8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::assign_bitwise_and;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_4d8,&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"&=",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_4d8,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4d8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::assign;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_4e8,&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"=",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_4e8,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4e8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::assign_bitwise_or;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_4f8,&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"|=",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_4f8,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4f8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::assign_bitwise_xor;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_508,&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"^=",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_508,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_508.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::assign_remainder;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_518,&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"%=",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_518,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_518.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::assign_shift_left;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_528,&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"<<=",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_528,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_528.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::assign_shift_right;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_538,&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,">>=",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_538,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_538.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::bitwise_and;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number_const(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_548,
             (_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"&",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_548,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_548.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::bitwise_complement;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number_const(chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_558,(_func_Boxed_Number_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"~",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_558,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_558.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::bitwise_xor;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number_const(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_568,
             (_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"^",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_568,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_568.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::bitwise_or;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number_const(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_578,
             (_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"|",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_578,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_578.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::assign_product;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_588,&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"*=",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_588,&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_588.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::assign_quotient;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_598,&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"/=",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_598,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_598.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::assign_sum;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_5a8,&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"+=",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_5a8,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5a8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::assign_difference;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_5b8,&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"-=",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_5b8,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5b8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::quotient;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number_const(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_5c8,
             (_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"/",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_5c8,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5c8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::shift_left;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number_const(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_5d8,
             (_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"<<",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_5d8,&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5d8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::product;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number_const(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_5e8,
             (_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"*",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_5e8,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5e8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::remainder;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number_const(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_5f8,
             (_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"%",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_5f8,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5f8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_610 = Boxed_Number::shift_right;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Number_const(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&),chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>,chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_608,
             (_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr **)&local_610);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,">>",&local_611);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_608,&local_408);
  std::__cxx11::string::~string((string *)&local_408);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_608.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

static void opers_arithmetic_pod(Module &m) {
      m.add(fun(&Boxed_Number::equals), "==");
      m.add(fun(&Boxed_Number::less_than), "<");
      m.add(fun(&Boxed_Number::greater_than), ">");
      m.add(fun(&Boxed_Number::greater_than_equal), ">=");
      m.add(fun(&Boxed_Number::less_than_equal), "<=");
      m.add(fun(&Boxed_Number::not_equal), "!=");

      m.add(fun(&Boxed_Number::pre_decrement), "--");
      m.add(fun(&Boxed_Number::pre_increment), "++");
      m.add(fun(&Boxed_Number::sum), "+");
      m.add(fun(&Boxed_Number::unary_plus), "+");
      m.add(fun(&Boxed_Number::unary_minus), "-");
      m.add(fun(&Boxed_Number::difference), "-");
      m.add(fun(&Boxed_Number::assign_bitwise_and), "&=");
      m.add(fun(&Boxed_Number::assign), "=");
      m.add(fun(&Boxed_Number::assign_bitwise_or), "|=");
      m.add(fun(&Boxed_Number::assign_bitwise_xor), "^=");
      m.add(fun(&Boxed_Number::assign_remainder), "%=");
      m.add(fun(&Boxed_Number::assign_shift_left), "<<=");
      m.add(fun(&Boxed_Number::assign_shift_right), ">>=");
      m.add(fun(&Boxed_Number::bitwise_and), "&");
      m.add(fun(&Boxed_Number::bitwise_complement), "~");
      m.add(fun(&Boxed_Number::bitwise_xor), "^");
      m.add(fun(&Boxed_Number::bitwise_or), "|");
      m.add(fun(&Boxed_Number::assign_product), "*=");
      m.add(fun(&Boxed_Number::assign_quotient), "/=");
      m.add(fun(&Boxed_Number::assign_sum), "+=");
      m.add(fun(&Boxed_Number::assign_difference), "-=");
      m.add(fun(&Boxed_Number::quotient), "/");
      m.add(fun(&Boxed_Number::shift_left), "<<");
      m.add(fun(&Boxed_Number::product), "*");
      m.add(fun(&Boxed_Number::remainder), "%");
      m.add(fun(&Boxed_Number::shift_right), ">>");
    }